

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall duckdb::Pipeline::Reset(Pipeline *this)

{
  pointer prVar1;
  PhysicalOperator *pPVar2;
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var3;
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var4;
  int iVar5;
  GlobalOperatorState *in_RAX;
  pointer *__ptr;
  pointer prVar6;
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  ResetSink(this);
  prVar6 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (this->operators).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (prVar6 == prVar1) {
      ResetSource(this,false);
      LOCK();
      (this->initialized)._M_base._M_i = true;
      UNLOCK();
      return;
    }
    pPVar2 = prVar6->_M_data;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&pPVar2->lock);
    if (iVar5 != 0) break;
    if ((pPVar2->op_state).
        super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
        .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl ==
        (GlobalOperatorState *)0x0) {
      (*pPVar2->_vptr_PhysicalOperator[9])(&local_38,pPVar2,this->executor->context);
      _Var4._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (GlobalOperatorState *)0x0;
      _Var3._M_head_impl =
           (pPVar2->op_state).
           super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
           .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
      (pPVar2->op_state).
      super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
      .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl = _Var4._M_head_impl
      ;
      if (_Var3._M_head_impl != (GlobalOperatorState *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_GlobalOperatorState[1])();
      }
      if (local_38._M_head_impl != (GlobalOperatorState *)0x0) {
        (*(local_38._M_head_impl)->_vptr_GlobalOperatorState[1])();
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pPVar2->lock);
    prVar6 = prVar6 + 1;
  }
  ::std::__throw_system_error(iVar5);
}

Assistant:

void Pipeline::Reset() {
	ResetSink();
	for (auto &op_ref : operators) {
		auto &op = op_ref.get();
		lock_guard<mutex> guard(op.lock);
		if (!op.op_state) {
			op.op_state = op.GetGlobalOperatorState(GetClientContext());
		}
	}
	ResetSource(false);
	// we no longer reset source here because this function is no longer guaranteed to be called by the main thread
	// source reset needs to be called by the main thread because resetting a source may call into clients like R
	initialized = true;
}